

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

TestPartResultReporterInterface ** __thiscall
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
          (ThreadLocal<testing::TestPartResultReporterInterface_*> *this)

{
  void *pvVar1;
  ValueHolder *pVVar2;
  ostream *poVar3;
  pthread_key_t *in_RDI;
  int in_stack_0000000c;
  char *in_stack_00000010;
  GTestLogSeverity in_stack_0000001c;
  GTestLog *in_stack_00000020;
  int gtest_error;
  ThreadLocalValueHolderBase *holder_base;
  ValueHolder *new_holder;
  ThreadLocalValueHolderBase *holder;
  TestPartResultReporterInterface **in_stack_ffffffffffffff98;
  ValueHolder *in_stack_ffffffffffffffa0;
  GTestLog *this_00;
  GTestLog local_40;
  int local_3c;
  ValueHolder *local_38;
  ThreadLocalValueHolderBase *in_stack_ffffffffffffffd0;
  TestPartResultReporterInterface **local_8;
  
  pvVar1 = pthread_getspecific(*in_RDI);
  if (pvVar1 == (void *)0x0) {
    pVVar2 = (ValueHolder *)operator_new(0x10);
    ValueHolder::ValueHolder(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_38 = pVVar2;
    local_3c = pthread_setspecific(*in_RDI,pVVar2);
    if (local_3c != 0) {
      this_00 = &local_40;
      GTestLog::GTestLog(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_0000000c);
      poVar3 = GTestLog::GetStream(this_00);
      poVar3 = std::operator<<(poVar3,"pthread_setspecific(key_, holder_base)");
      poVar3 = std::operator<<(poVar3,"failed with error ");
      std::ostream::operator<<(poVar3,local_3c);
      GTestLog::~GTestLog(this_00);
    }
    local_8 = ValueHolder::pointer(pVVar2);
  }
  else {
    pVVar2 = CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
                       (in_stack_ffffffffffffffd0);
    local_8 = ValueHolder::pointer(pVVar2);
  }
  return local_8;
}

Assistant:

T* GetOrCreateValue() const {
    ThreadLocalValueHolderBase* const holder =
        static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
    if (holder != NULL) {
      return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
    }

    ValueHolder* const new_holder = new ValueHolder(default_);
    ThreadLocalValueHolderBase* const holder_base = new_holder;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
    return new_holder->pointer();
  }